

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O0

ChannelUri * aeron::archive::ChannelUri::parse(ChannelUri *__return_storage_ptr__,string *str)

{
  __node_base_ptr *this;
  undefined8 uVar1;
  bool bVar2;
  IllegalArgumentException *pIVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  IllegalStateException *this_00;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_28a;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  char local_181;
  undefined1 local_180 [7];
  char c;
  ParamsMap params;
  string buffer;
  undefined1 local_120 [4];
  State state;
  string key;
  string media;
  string local_d8;
  allocator local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string prefix;
  size_t position;
  string *str_local;
  
  prefix.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_40);
  bVar2 = anon_unknown.dwarf_55476::startsWith
                    (str,(string *)(anonymous_namespace)::SPY_PREFIX_abi_cxx11_);
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)local_40,(string *)(anonymous_namespace)::SPY_QUALIFIER_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    prefix.field_2._8_8_ = lVar5 + prefix.field_2._8_8_;
  }
  bVar2 = anon_unknown.dwarf_55476::startsWith
                    (str,prefix.field_2._8_4_,
                     (string *)(anonymous_namespace)::AERON_PREFIX_abi_cxx11_);
  if (bVar2) {
    lVar5 = std::__cxx11::string::size();
    prefix.field_2._8_8_ = lVar5 + prefix.field_2._8_8_;
    std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_120);
    buffer.field_2._12_4_ = 0;
    this = &params._M_h._M_single_bucket;
    std::__cxx11::string::string((string *)this);
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)this);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_180);
    while( true ) {
      while( true ) {
        while( true ) {
          uVar1 = prefix.field_2._8_8_;
          uVar6 = std::__cxx11::string::size();
          if (uVar6 <= (ulong)uVar1) {
            if (buffer.field_2._12_4_ == 0) {
              std::__cxx11::string::operator=
                        ((string *)(key.field_2._M_local_buf + 8),
                         (string *)&params._M_h._M_single_bucket);
            }
            else {
              if (buffer.field_2._12_4_ != 2) {
                pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
                std::__cxx11::to_string(&local_2d0,buffer.field_2._12_4_);
                std::operator+(&local_2b0,"no more input found, state=",&local_2d0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_2f0,
                           "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)"
                           ,&local_2f1);
                pcVar4 = aeron::util::past_prefix
                                   ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                                   );
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_318,pcVar4,&local_319);
                aeron::util::IllegalArgumentException::IllegalArgumentException
                          (pIVar3,&local_2b0,&local_2f0,&local_318,0xc6);
                __cxa_throw(pIVar3,&aeron::util::IllegalArgumentException::typeinfo,
                            aeron::util::IllegalArgumentException::~IllegalArgumentException);
              }
              pmVar7 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_180,(key_type *)local_120);
              std::__cxx11::string::operator=
                        ((string *)pmVar7,(string *)&params._M_h._M_single_bucket);
            }
            ChannelUri(__return_storage_ptr__,(string *)local_40,(string *)((long)&key.field_2 + 8),
                       (ParamsMap *)local_180);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_180);
            std::__cxx11::string::~string((string *)&params._M_h._M_single_bucket);
            std::__cxx11::string::~string((string *)local_120);
            std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_40);
            return __return_storage_ptr__;
          }
          prefix.field_2._8_8_ = prefix.field_2._8_8_ + 1;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
          local_181 = *pcVar4;
          if (buffer.field_2._12_4_ != 0) break;
          if (local_181 == ':') {
            local_1fa = 1;
            pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1a8,"encountered \':\' within media definition",&local_1a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1d0,
                       "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",
                       &local_1d1);
            pcVar4 = aeron::util::past_prefix
                               ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                               );
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1f8,pcVar4,&local_1f9);
            aeron::util::IllegalArgumentException::IllegalArgumentException
                      (pIVar3,&local_1a8,&local_1d0,&local_1f8,0x91);
            local_1fa = 0;
            __cxa_throw(pIVar3,&aeron::util::IllegalArgumentException::typeinfo,
                        aeron::util::IllegalArgumentException::~IllegalArgumentException);
          }
          if (local_181 == '?') {
            std::__cxx11::string::operator=
                      ((string *)(key.field_2._M_local_buf + 8),
                       (string *)&params._M_h._M_single_bucket);
            std::__cxx11::string::clear();
            buffer.field_2._12_4_ = 1;
          }
          else {
            std::__cxx11::string::push_back((char)&params + '0');
          }
        }
        if (buffer.field_2._12_4_ != 1) break;
        if (local_181 == '=') {
          std::__cxx11::string::operator=
                    ((string *)local_120,(string *)&params._M_h._M_single_bucket);
          std::__cxx11::string::clear();
          buffer.field_2._12_4_ = 2;
        }
        else {
          std::__cxx11::string::push_back((char)&params + '0');
        }
      }
      if (buffer.field_2._12_4_ != 2) break;
      if (local_181 == '|') {
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180,(key_type *)local_120);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&params._M_h._M_single_bucket);
        std::__cxx11::string::clear();
        buffer.field_2._12_4_ = 1;
      }
      else {
        std::__cxx11::string::push_back((char)&params + '0');
      }
    }
    local_28a = 1;
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_240,buffer.field_2._12_4_);
    std::operator+(&local_220,"unexpected state=",&local_240);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_260,
               "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",&local_261
              );
    pcVar4 = aeron::util::past_prefix
                       ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                       );
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,pcVar4,&local_289);
    aeron::util::IllegalStateException::IllegalStateException
              (this_00,&local_220,&local_260,&local_288,0xb7);
    local_28a = 0;
    __cxa_throw(this_00,&aeron::util::IllegalStateException::typeinfo,
                aeron::util::IllegalStateException::~IllegalStateException);
  }
  media.field_2._M_local_buf[0xe] = '\x01';
  pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
  std::operator+(&local_90,"Aeron URIs must start with \'aeron:\', found: \'",str);
  std::operator+(&local_70,&local_90,"\'");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,
             "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",&local_b1);
  pcVar4 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,pcVar4,(allocator *)(media.field_2._M_local_buf + 0xf));
  aeron::util::IllegalArgumentException::IllegalArgumentException
            (pIVar3,&local_70,&local_b0,&local_d8,0x76);
  media.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(pIVar3,&aeron::util::IllegalArgumentException::typeinfo,
              aeron::util::IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

ChannelUri ChannelUri::parse(const std::string& str) {
    std::size_t position = 0;
    std::string prefix;

    if (startsWith(str, SPY_PREFIX)) {
        prefix = SPY_QUALIFIER;
        position += SPY_PREFIX.size();
    }

    if (!startsWith(str, position, AERON_PREFIX)) {
        throw aeron::util::IllegalArgumentException("Aeron URIs must start with 'aeron:', found: '" + str + "'",
                                                    SOURCEINFO);
    } else {
        position += AERON_PREFIX.size();
    }

    std::string media, key;
    State state = State::MEDIA;

    std::string buffer;
    buffer.reserve(str.size());

    ParamsMap params;

    while (position < str.size()) {
        char c = str[position++];

        switch (state) {
            case State::MEDIA:
                switch (c) {
                    case '?':
                        media = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    case ':':
                        throw aeron::util::IllegalArgumentException("encountered ':' within media definition",
                                                                    SOURCEINFO);

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_KEY:
                switch (c) {
                    case '=':
                        key = buffer;
                        buffer.clear();
                        state = State::PARAMS_VALUE;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_VALUE:
                switch (c) {
                    case '|':
                        params[key] = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            default:
                throw aeron::util::IllegalStateException("unexpected state=" + std::to_string(static_cast<int>(state)),
                                                         SOURCEINFO);
        }
    }

    switch (state) {
        case State::MEDIA:
            media = buffer;
            break;

        case State::PARAMS_VALUE:
            params[key] = buffer;
            break;

        default:
            throw aeron::util::IllegalArgumentException(
                "no more input found, state=" + std::to_string(static_cast<int>(state)), SOURCEINFO);
    }

    return ChannelUri(prefix, media, std::move(params));
}